

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::recombine(wasm::Function*)::Modder::visitExpression(wasm::Expression__
          (void *this,Expression *curr)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  undefined8 uVar4;
  bool bVar5;
  uint32_t uVar6;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *vec;
  value_type *ppEVar7;
  key_type pEVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  long *plVar12;
  long *plVar13;
  long lVar14;
  key_type local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  uVar6 = Random::upTo((Random *)(*(long *)((long)this + 0xe8) + 0x18),10);
  if ((uVar6 == 0) &&
     (bVar5 = canBeArbitrarilyReplaced(*(TranslateToFuzzReader **)((long)this + 0xe8),curr), bVar5))
  {
    vec = InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
          ::operator[]((InsertOrderedMap<wasm::Type,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                        *)(*(long *)((long)this + 0xe0) + 0xe0),&curr->type);
    if ((vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (vec->super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("!candidates.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                    ,0x66e,
                    "void wasm::TranslateToFuzzReader::recombine(Function *)::Modder::visitExpression(Expression *)"
                   );
    }
    ppEVar7 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        ((Random *)(*(long *)((long)this + 0xe8) + 0x18),vec);
    local_58 = (key_type)0x0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<wasm::Expression_*(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/manipulation.h:86:15)>
               ::_M_manager;
    pEVar8 = (key_type)
             wasm::ExpressionManipulator::flexibleCopy(*ppEVar7,*(undefined8 *)((long)this + 0xd8));
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    lVar1 = *(long *)((long)this + 200);
    if ((lVar1 != 0) && (uVar2 = **this, *(long *)(lVar1 + 0xf0) != 0)) {
      local_58 = pEVar8;
      sVar9 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)(lVar1 + 0xd8),&local_58);
      if (sVar9 == 0) {
        uVar11 = uVar2 % *(ulong *)(lVar1 + 0xe0);
        plVar12 = *(long **)(*(long *)(lVar1 + 0xd8) + uVar11 * 8);
        plVar13 = (long *)0x0;
        if ((plVar12 != (long *)0x0) &&
           (plVar3 = (long *)*plVar12, plVar13 = plVar12, ((long *)*plVar12)[1] != uVar2)) {
          while (plVar12 = plVar3, plVar3 = (long *)*plVar12, plVar3 != (long *)0x0) {
            plVar13 = (long *)0x0;
            if (((ulong)plVar3[1] % *(ulong *)(lVar1 + 0xe0) != uVar11) ||
               (plVar13 = plVar12, plVar3[1] == uVar2)) goto LAB_0015131a;
          }
          plVar13 = (long *)0x0;
        }
LAB_0015131a:
        if (plVar13 == (long *)0x0) {
          lVar14 = 0;
        }
        else {
          lVar14 = *plVar13;
        }
        if (lVar14 != 0) {
          pmVar10 = std::__detail::
                    _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)(lVar1 + 0xd8),&local_58);
          uVar4 = *(undefined8 *)(lVar14 + 0x18);
          *(undefined8 *)
           &(pmVar10->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
               *(undefined8 *)(lVar14 + 0x10);
          *(undefined8 *)
           ((long)&(pmVar10->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
           + 8) = uVar4;
          *(undefined8 *)
           ((long)&(pmVar10->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
                   ._M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
                   _M_payload + 4) = *(undefined8 *)(lVar14 + 0x20);
        }
      }
    }
    **this = pEVar8;
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      if (parent.oneIn(10) && parent.canBeArbitrarilyReplaced(curr)) {
        // Replace it!
        auto& candidates = scanner.exprsByType[curr->type];
        assert(!candidates.empty()); // this expression itself must be there
        auto* rep = parent.pick(candidates);
        replaceCurrent(ExpressionManipulator::copy(rep, wasm));
      }
    }